

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  string *psVar1;
  pointer pRVar2;
  pointer pcVar3;
  pointer pFVar4;
  pointer pFVar5;
  pointer pFVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar10;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  ColourMode *pCVar12;
  ReusableStringStream *pRVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  string *psVar14;
  bool bVar15;
  iterator __end2;
  pointer pRVar16;
  ColourMode *pCVar17;
  StringRef reporterSpec;
  char *default_spec;
  TestSpecParser parser;
  char local_1e9;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_1e8;
  vector<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_> *local_1d0;
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [8];
  _Alloc_hider _Stack_1a8;
  pointer local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  ColourMode local_188;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  ConfigData *local_150;
  ConfigData *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  char *local_138;
  undefined1 local_130 [16];
  undefined1 local_120 [48];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Base_ptr local_b0;
  _Base_ptr p_Stack_a8;
  pointer local_a0;
  pointer puStack_98;
  pointer local_90;
  pointer puStack_88;
  pointer local_80;
  pointer puStack_78;
  pointer local_70;
  pointer pFStack_68;
  pointer local_60;
  pointer pFStack_58;
  pointer local_50;
  pointer pbStack_48;
  pointer local_40;
  ITagAliasRegistry *local_38;
  
  (this->super_IConfig)._vptr_IConfig = (_func_int **)&PTR__Config_001af1e0;
  local_148 = data;
  ConfigData::ConfigData(&this->m_data,data);
  local_1d0 = &this->m_processedReporterSpecs;
  *(undefined8 *)
   ((long)&(this->m_testSpec).m_invalidSpecs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_testSpec).m_invalidSpecs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->m_testSpec).m_invalidSpecs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testSpec).m_invalidSpecs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_processedReporterSpecs).
  super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_processedReporterSpecs).
  super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_processedReporterSpecs).
  super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar14 = (this->m_data).testsOrTags.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar14 != psVar1) {
    do {
      trim((string *)local_130,psVar14);
      std::__cxx11::string::operator=((string *)psVar14,(string *)local_130);
      if ((ReporterSpec *)local_130._0_8_ != (ReporterSpec *)local_120) {
        operator_delete((void *)local_130._0_8_,(ulong)(local_120._0_8_ + 1));
      }
      psVar14 = psVar14 + 1;
    } while (psVar14 != psVar1);
  }
  psVar14 = (this->m_data).sectionsToRun.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_data).sectionsToRun.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar14 != psVar1) {
    do {
      trim((string *)local_130,psVar14);
      std::__cxx11::string::operator=((string *)psVar14,(string *)local_130);
      if ((ReporterSpec *)local_130._0_8_ != (ReporterSpec *)local_120) {
        operator_delete((void *)local_130._0_8_,(ulong)(local_120._0_8_ + 1));
      }
      psVar14 = psVar14 + 1;
    } while (psVar14 != psVar1);
  }
  if ((this->m_data).reporterSpecifications.
      super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_data).reporterSpecifications.
      super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_138 = "console";
    reporterSpec.m_size = 7;
    reporterSpec.m_start = "console";
    parseReporterSpec((Optional<Catch::ReporterSpec> *)local_130,reporterSpec);
    if ((ReporterSpec *)local_130._0_8_ == (ReporterSpec *)0x0) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 local_1e8.
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 "Cannot parse the provided default reporter spec: \'",0x32);
      pRVar13 = ReusableStringStream::operator<<((ReusableStringStream *)&local_1e8,&local_138);
      local_1e9 = '\'';
      std::__ostream_insert<char,std::char_traits<char>>(pRVar13->m_oss,&local_1e9,1);
      std::__cxx11::stringbuf::str();
      throw_domain_error((string *)local_1c8);
    }
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::
    emplace_back<Catch::ReporterSpec>
              (&(this->m_data).reporterSpecifications,(ReporterSpec *)local_130._0_8_);
    Optional<Catch::ReporterSpec>::reset((Optional<Catch::ReporterSpec> *)local_130);
  }
  pcVar9 = getenv("BAZEL_TEST");
  if (pcVar9 != (char *)0x0) {
    readBazelEnvVars(this);
  }
  local_150 = &this->m_data;
  pSVar10 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar8 = (*(pSVar10->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[4])(pSVar10);
  local_38 = (ITagAliasRegistry *)CONCAT44(extraout_var,iVar8);
  local_120._16_8_ = local_120 + 0x20;
  local_130[8] = false;
  local_130._0_8_ = (pointer)0x0;
  local_120._0_8_ = (pointer)0x0;
  local_120._8_8_ = 0;
  local_120._24_8_ = 0;
  local_120[0x20] = '\0';
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0._M_p = (pointer)&local_c0;
  local_c8 = 0;
  local_c0._M_local_buf[0] = _S_red;
  local_b0 = (_Base_ptr)0x0;
  p_Stack_a8 = (_Base_ptr)0x0;
  local_a0 = (pointer)0x0;
  puStack_98 = (pointer)0x0;
  local_90 = (pointer)0x0;
  puStack_88 = (pointer)0x0;
  local_80 = (pointer)0x0;
  puStack_78 = (pointer)0x0;
  local_70 = (pointer)0x0;
  pFStack_68 = (pointer)0x0;
  local_60 = (pointer)0x0;
  pFStack_58 = (pointer)0x0;
  local_50 = (pointer)0x0;
  pbStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  psVar14 = (this->m_data).testsOrTags.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar14 != psVar1) {
    this->m_hasTestFilters = true;
    do {
      TestSpecParser::parse((TestSpecParser *)local_130,psVar14);
      psVar14 = psVar14 + 1;
    } while (psVar14 != psVar1);
  }
  TestSpecParser::addFilter((TestSpecParser *)local_130);
  pFVar6 = pFStack_58;
  pFVar5 = local_60;
  pFVar4 = pFStack_68;
  pFStack_68 = (pointer)0x0;
  local_60 = (pointer)0x0;
  pFStack_58 = (pointer)0x0;
  local_1b0 = (undefined1  [8])local_50;
  _Stack_1a8._M_p = (pointer)pbStack_48;
  local_1a0 = local_40;
  local_50 = (pointer)0x0;
  pbStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  local_1e8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->m_testSpec).m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_1e8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->m_testSpec).m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_1e8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_testSpec).m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = pFVar4;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = pFVar5;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pFVar6;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1c8._16_8_ = (pointer)0x0;
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_1e8);
  local_1e8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->m_testSpec).m_invalidSpecs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_1e8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->m_testSpec).m_invalidSpecs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_1e8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->m_testSpec).m_invalidSpecs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_testSpec).m_invalidSpecs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b0;
  (this->m_testSpec).m_invalidSpecs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_1a8._M_p;
  (this->m_testSpec).m_invalidSpecs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1a0;
  local_1b0 = (undefined1  [8])0x0;
  _Stack_1a8._M_p = (pointer)0x0;
  local_1a0 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b0);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_1c8)
  ;
  pRVar16 = (this->m_data).reporterSpecifications.
            super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar2 = (this->m_data).reporterSpecifications.
           super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar16 != pRVar2) {
    local_140 = &local_148->defaultOutputFilename;
    pCVar17 = &local_148->defaultColourMode;
    bVar15 = false;
    do {
      bVar7 = bVar15;
      if (((pRVar16->m_outputFileName).nullableValue ==
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
         (bVar7 = true, bVar15)) {
        ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   local_1e8.
                   super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   "Internal error: cannot use default output for multiple reporters",0x40);
        std::__cxx11::stringbuf::str();
        throw_domain_error((string *)local_1c8);
      }
      bVar15 = bVar7;
      local_1c8._0_8_ = local_1c8 + 0x10;
      pcVar3 = (pRVar16->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,pcVar3,pcVar3 + (pRVar16->m_name)._M_string_length);
      pbVar11 = (pRVar16->m_outputFileName).nullableValue;
      if (pbVar11 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar11 = local_140;
      }
      _Stack_1a8._M_p = (pointer)&local_198;
      pcVar3 = (pbVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_1a8,pcVar3,pcVar3 + pbVar11->_M_string_length);
      pCVar12 = (pRVar16->m_colourMode).nullableValue;
      if (pCVar12 == (ColourMode *)0x0) {
        pCVar12 = pCVar17;
      }
      local_188 = *pCVar12;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_180,&(pRVar16->m_customOptions)._M_t);
      std::vector<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>::
      emplace_back<Catch::ProcessedReporterSpec>(local_1d0,(ProcessedReporterSpec *)local_1c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_1a8._M_p != &local_198) {
        operator_delete(_Stack_1a8._M_p,local_198._M_allocated_capacity + 1);
      }
      if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
      pRVar16 = pRVar16 + 1;
    } while (pRVar16 != pRVar2);
  }
  TestSpecParser::~TestSpecParser((TestSpecParser *)local_130);
  return;
}

Assistant:

Config::Config( ConfigData const& data ):
        m_data( data ) {
        // We need to trim filter specs to avoid trouble with superfluous
        // whitespace (esp. important for bdd macros, as those are manually
        // aligned with whitespace).

        for (auto& elem : m_data.testsOrTags) {
            elem = trim(elem);
        }
        for (auto& elem : m_data.sectionsToRun) {
            elem = trim(elem);
        }

        // Insert the default reporter if user hasn't asked for a specific one
        if ( m_data.reporterSpecifications.empty() ) {
#if defined( CATCH_CONFIG_DEFAULT_REPORTER )
            const auto default_spec = CATCH_CONFIG_DEFAULT_REPORTER;
#else
            const auto default_spec = "console";
#endif
            auto parsed = parseReporterSpec(default_spec);
            CATCH_ENFORCE( parsed,
                           "Cannot parse the provided default reporter spec: '"
                               << default_spec << '\'' );
            m_data.reporterSpecifications.push_back( std::move( *parsed ) );
        }

        if ( enableBazelEnvSupport() ) {
            readBazelEnvVars();
        }

        // Bazel support can modify the test specs, so parsing has to happen
        // after reading Bazel env vars.
        TestSpecParser parser( ITagAliasRegistry::get() );
        if ( !m_data.testsOrTags.empty() ) {
            m_hasTestFilters = true;
            for ( auto const& testOrTags : m_data.testsOrTags ) {
                parser.parse( testOrTags );
            }
        }
        m_testSpec = parser.testSpec();


        // We now fixup the reporter specs to handle default output spec,
        // default colour spec, etc
        bool defaultOutputUsed = false;
        for ( auto const& reporterSpec : m_data.reporterSpecifications ) {
            // We do the default-output check separately, while always
            // using the default output below to make the code simpler
            // and avoid superfluous copies.
            if ( reporterSpec.outputFile().none() ) {
                CATCH_ENFORCE( !defaultOutputUsed,
                               "Internal error: cannot use default output for "
                               "multiple reporters" );
                defaultOutputUsed = true;
            }

            m_processedReporterSpecs.push_back( ProcessedReporterSpec{
                reporterSpec.name(),
                reporterSpec.outputFile() ? *reporterSpec.outputFile()
                                          : data.defaultOutputFilename,
                reporterSpec.colourMode().valueOr( data.defaultColourMode ),
                reporterSpec.customOptions() } );
        }
    }